

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Cluster::Load(Cluster *this,longlong *pos,long *len)

{
  IMkvReader *pReader;
  bool bVar1;
  int iVar2;
  longlong lVar3;
  ulong size;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long pos_00;
  longlong avail;
  longlong local_60;
  longlong local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  longlong total;
  
  if (this->m_pSegment == (Segment *)0x0) {
    return -1;
  }
  if (this->m_timecode < 0) {
    if (this->m_pos != this->m_element_start) {
      return -1;
    }
    if (-1 < this->m_element_size) {
      return -1;
    }
    pReader = this->m_pSegment->m_pReader;
    iVar2 = (*pReader->_vptr_IMkvReader[1])(pReader,&total,&avail);
    if (iVar2 < 0) {
      return (long)iVar2;
    }
    lVar3 = this->m_pos;
    if ((-1 < total) && (total < lVar3 || total < avail)) {
      return -2;
    }
    *pos = lVar3;
    lVar4 = -3;
    if (lVar3 < avail) {
      lVar3 = GetUIntLength(pReader,lVar3,len);
      if (lVar3 < 0) {
        return lVar3;
      }
      if (lVar3 != 0) {
        return -3;
      }
      if (avail < *len + *pos) {
        return -3;
      }
      lVar3 = ReadID(pReader,*pos,len);
      if (lVar3 < 0) {
        return lVar3;
      }
      if (lVar3 != 0x1f43b675) {
        return -2;
      }
      lVar5 = *pos + *len;
      *pos = lVar5;
      if (lVar5 < avail) {
        lVar3 = GetUIntLength(pReader,lVar5,len);
        if (lVar3 < 0) {
          return lVar3;
        }
        if (lVar3 != 0) {
          return -3;
        }
        if (avail < *len + *pos) {
          return -3;
        }
        local_40 = ReadUInt(pReader,*pos,len);
        if ((long)local_40 < 0) {
          return -1;
        }
        if (local_40 == 0) {
          return -2;
        }
        lVar5 = *pos + *len;
        uVar6 = -1L << ((char)*len * '\a' & 0x3fU) ^ local_40;
        if (uVar6 == 0xffffffffffffffff) {
          local_40 = 0xffffffffffffffff;
        }
        local_48 = local_40 + lVar5;
        *pos = lVar5;
        if (uVar6 != 0xffffffffffffffff) {
          uVar6 = local_48;
        }
        local_58 = -1;
        local_50 = -1;
        while( true ) {
          if ((-1 < (long)uVar6) && (bVar1 = true, (long)uVar6 <= lVar5)) break;
          if (avail <= lVar5) goto LAB_00114a8e;
          lVar3 = GetUIntLength(pReader,lVar5,len);
          if (lVar3 < 0) {
            return lVar3;
          }
          if (lVar3 != 0) {
            return -3;
          }
          lVar5 = *len + *pos;
          if (-1 < (long)uVar6 && (long)uVar6 < lVar5) {
            return -2;
          }
          if (avail < lVar5) {
            return -3;
          }
          local_60 = ReadID(pReader,*pos,len);
          if (local_60 < 0) {
            return local_60;
          }
          if (local_60 == 0) {
            return -2;
          }
          bVar1 = true;
          if ((local_60 == 0x1c53bb6b) || (local_60 == 0x1f43b675)) break;
          lVar5 = *pos + *len;
          *pos = lVar5;
          if (avail <= lVar5) goto LAB_00114a8e;
          lVar3 = GetUIntLength(pReader,lVar5,len);
          if (lVar3 < 0) {
            return lVar3;
          }
          if (lVar3 != 0) {
            return -3;
          }
          lVar5 = *len + *pos;
          if (-1 < (long)uVar6 && (long)uVar6 < lVar5) {
            return -2;
          }
          if (avail < lVar5) {
            return -3;
          }
          size = ReadUInt(pReader,*pos,len);
          if ((long)size < 0) {
            return size;
          }
          if ((-1L << ((char)*len * '\a' & 0x3fU) ^ size) == 0xffffffffffffffff) {
            return -2;
          }
          pos_00 = *len + *pos;
          *pos = pos_00;
          if (-1 < (long)uVar6 && (long)uVar6 < pos_00) {
            return -2;
          }
          lVar5 = pos_00;
          if (size != 0) {
            lVar5 = size + pos_00;
            if ((-1 < (long)uVar6) && ((long)uVar6 < lVar5)) {
              return -2;
            }
            if (local_60 == 0xe7) {
              *len = size;
              if (avail < lVar5) {
                return -3;
              }
              local_58 = UnserializeUInt(pReader,pos_00,size);
              if (local_58 < 0) {
                return local_58;
              }
              lVar5 = *pos + size;
              local_50 = lVar5;
            }
            else if ((local_60 == 0xa0) || (local_60 == 0xa3)) {
              bVar1 = false;
              break;
            }
            *pos = lVar5;
            if ((-1 < (long)uVar6) && ((long)uVar6 < lVar5)) {
              return -2;
            }
          }
        }
        if (bVar1) {
          return -2;
        }
        if (-1 < (long)uVar6 && (long)uVar6 < *pos) {
          return -2;
        }
        if (local_58 < 0) {
          return -2;
        }
        this->m_pos = local_50;
        this->m_timecode = local_58;
        if (-1 < (long)local_40) {
          this->m_element_size = local_48 - this->m_element_start;
        }
        goto LAB_0011470f;
      }
    }
LAB_00114a8e:
    *len = 1;
  }
  else {
LAB_0011470f:
    lVar4 = 0;
  }
  return lVar4;
}

Assistant:

long Cluster::Load(long long& pos, long& len) const {
  if (m_pSegment == NULL)
    return E_PARSE_FAILED;

  if (m_timecode >= 0)  // at least partially loaded
    return 0;

  if (m_pos != m_element_start || m_element_size >= 0)
    return E_PARSE_FAILED;

  IMkvReader* const pReader = m_pSegment->m_pReader;
  long long total, avail;
  const int status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && (avail > total || m_pos > total))
    return E_FILE_FORMAT_INVALID;

  pos = m_pos;

  long long cluster_size = -1;

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error or underflow
    return static_cast<long>(result);

  if (result > 0)
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long id_ = ReadID(pReader, pos, len);

  if (id_ < 0)  // error
    return static_cast<long>(id_);

  if (id_ != libwebm::kMkvCluster)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume id

  // read cluster size

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long size = ReadUInt(pReader, pos, len);

  if (size < 0)  // error
    return static_cast<long>(cluster_size);

  if (size == 0)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume length of size of element

  const long long unknown_size = (1LL << (7 * len)) - 1;

  if (size != unknown_size)
    cluster_size = size;

  // pos points to start of payload
  long long timecode = -1;
  long long new_pos = -1;
  bool bBlock = false;

  long long cluster_stop = (cluster_size < 0) ? -1 : pos + cluster_size;

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      break;

    // Parse ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)  // error
      return static_cast<long>(id);

    if (id == 0)
      return E_FILE_FORMAT_INVALID;

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if (id == libwebm::kMkvCluster)
      break;

    if (id == libwebm::kMkvCues)
      break;

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume size field

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // pos now points to start of payload

    if (size == 0)
      continue;

    if ((cluster_stop >= 0) && ((pos + size) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvTimecode) {
      len = static_cast<long>(size);

      if ((pos + size) > avail)
        return E_BUFFER_NOT_FULL;

      timecode = UnserializeUInt(pReader, pos, size);

      if (timecode < 0)  // error (or underflow)
        return static_cast<long>(timecode);

      new_pos = pos + size;

      if (bBlock)
        break;
    } else if (id == libwebm::kMkvBlockGroup) {
      bBlock = true;
      break;
    } else if (id == libwebm::kMkvSimpleBlock) {
      bBlock = true;
      break;
    }

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (cluster_stop >= 0 && pos > cluster_stop)
    return E_FILE_FORMAT_INVALID;

  if (timecode < 0)  // no timecode found
    return E_FILE_FORMAT_INVALID;

  if (!bBlock)
    return E_FILE_FORMAT_INVALID;

  m_pos = new_pos;  // designates position just beyond timecode payload
  m_timecode = timecode;  // m_timecode >= 0 means we're partially loaded

  if (cluster_size >= 0)
    m_element_size = cluster_stop - m_element_start;

  return 0;
}